

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::registerInterface(CommonCore *this,ActionMessage *command)

{
  int32_t index;
  action_t aVar1;
  GlobalBrokerId GVar2;
  InterfaceHandle IVar3;
  BaseTimeCoordinator *pBVar4;
  byte *pbVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  string_view endpointType;
  string_view type_in;
  string_view units;
  string_view type_out;
  int iVar9;
  route_id rVar10;
  BasicHandleInfo *otherHandle;
  FederateState *this_00;
  string *psVar11;
  TranslatorFederate *this_01;
  FilterFederate *this_02;
  string_view key;
  string_view key_00;
  ActionMessage add;
  
  if ((command->dest_id).gid != 0) {
    routeMessage(this,command);
    return;
  }
  index = (command->source_handle).hid;
  add._0_8_ = &(this->handles).m_mutex;
  add.source_id.gid._0_1_ = 1;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)add._0_8_);
  otherHandle = HandleManager::getHandleInfo(&(this->handles).m_obj,index);
  if (otherHandle != (BasicHandleInfo *)0x0) {
    HandleManager::addHandleAtIndex(&this->loopHandles,otherHandle,index);
  }
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)&add);
  aVar1 = command->messageAction;
  if (aVar1 != cmd_reg_pub) {
    if (aVar1 == cmd_reg_filter) {
      this_02 = this->filterFed;
      if (this_02 == (FilterFederate *)0x0) {
        generateFilterFederate(this);
        this_02 = this->filterFed;
      }
      GVar2.gid = (this->filterFedID)._M_i.gid;
      IVar3.hid = (command->source_handle).hid;
      pbVar5 = (command->payload).heap;
      sVar6 = (command->payload).bufferSize;
      psVar11 = ActionMessage::getString_abi_cxx11_(command,0);
      pcVar7 = (psVar11->_M_dataplus)._M_p;
      sVar8 = psVar11->_M_string_length;
      psVar11 = ActionMessage::getString_abi_cxx11_(command,1);
      type_in._M_str = pcVar7;
      type_in._M_len = sVar8;
      type_out._M_str = (psVar11->_M_dataplus)._M_p;
      type_out._M_len = psVar11->_M_string_length;
      key_00._M_str = (char *)pbVar5;
      key_00._M_len = sVar6;
      FilterFederate::createFilter
                (this_02,GVar2,IVar3,key_00,type_in,type_out,(bool)((byte)(command->flags >> 9) & 1)
                );
      connectFilterTiming(this);
    }
    else if (aVar1 != cmd_reg_input) {
      if (aVar1 == cmd_reg_translator) {
        this_01 = this->translatorFed;
        if (this_01 == (TranslatorFederate *)0x0) {
          generateTranslatorFederate(this);
          this_01 = this->translatorFed;
        }
        GVar2.gid = (this->translatorFedID)._M_i.gid;
        IVar3.hid = (command->source_handle).hid;
        pbVar5 = (command->payload).heap;
        sVar6 = (command->payload).bufferSize;
        psVar11 = ActionMessage::getString_abi_cxx11_(command,0);
        pcVar7 = (psVar11->_M_dataplus)._M_p;
        sVar8 = psVar11->_M_string_length;
        psVar11 = ActionMessage::getString_abi_cxx11_(command,1);
        endpointType._M_str = pcVar7;
        endpointType._M_len = sVar8;
        units._M_str = (psVar11->_M_dataplus)._M_p;
        units._M_len = psVar11->_M_string_length;
        key._M_str = (char *)pbVar5;
        key._M_len = sVar6;
        TranslatorFederate::createTranslator(this_01,GVar2,IVar3,key,endpointType,units);
      }
      else if (aVar1 != cmd_reg_datasink) {
        if (aVar1 != cmd_reg_end) {
          return;
        }
        if (((this->super_BrokerBase).globalTime == false) && ((command->flags & 0x400) == 0)) {
          pBVar4 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          iVar9 = (*pBVar4->_vptr_BaseTimeCoordinator[4])
                            (pBVar4,(ulong)(uint)(command->source_id).gid);
          if (((char)iVar9 != '\0') &&
             (this_00 = getFederateCore(this,(GlobalFederateId)(command->source_id).gid),
             this_00 != (FederateState *)0x0)) {
            ActionMessage::ActionMessage
                      (&add,cmd_add_interdependency,
                       (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                       (GlobalFederateId)(command->source_id).gid);
            add.flags._1_1_ = add.flags._1_1_ | 0x20;
            FederateState::addAction(this_00,&add);
            pBVar4 = (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
            (*pBVar4->_vptr_BaseTimeCoordinator[5])
                      (pBVar4,(ulong)(uint)(this_00->global_id)._M_i.gid);
            BaseTimeCoordinator::setAsChild
                      ((this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
                       (GlobalFederateId)(this_00->global_id)._M_i.gid);
            ActionMessage::~ActionMessage(&add);
          }
          if (((this->super_BrokerBase).hasTimeDependency == false) &&
             (pBVar4 = (this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
             iVar9 = (*pBVar4->_vptr_BaseTimeCoordinator[4])
                               (pBVar4,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid),
             (char)iVar9 != '\0')) {
            (this->super_BrokerBase).hasTimeDependency = true;
            ActionMessage::ActionMessage
                      (&add,cmd_add_interdependency,
                       (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                       (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
            add.flags._1_1_ = add.flags._1_1_ | 0x40;
            rVar10 = getRoute(this,(GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
            (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)(uint)rVar10.rid,&add);
            pBVar4 = (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
            (*pBVar4->_vptr_BaseTimeCoordinator[5])
                      (pBVar4,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
            BaseTimeCoordinator::setAsParent
                      ((this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
                       (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
            ActionMessage::~ActionMessage(&add);
          }
        }
      }
    }
  }
  if ((command->payload).bufferSize != 0) {
    (*(this->super_Core)._vptr_Core[0x6c])(this,0,command);
  }
  return;
}

Assistant:

void CommonCore::registerInterface(ActionMessage& command)
{
    if (command.dest_id == parent_broker_id) {
        auto handle = command.source_handle;
        auto& loopHandleRef = loopHandles;
        handles.read([handle, &loopHandleRef](auto& hand) {
            auto ifc = hand.getHandleInfo(handle.baseValue());
            if (ifc != nullptr) {
                loopHandleRef.addHandleAtIndex(*ifc, handle.baseValue());
            }
        });

        switch (command.action()) {
            case CMD_REG_INPUT:
            case CMD_REG_PUB:
            case CMD_REG_DATASINK:
                break;
            case CMD_REG_ENDPOINT:
                if (globalTime) {
                    break;
                }
                if (checkActionFlag(command, targeted_flag)) {
                    break;
                }
                if (timeCoord->addDependency(command.source_id)) {
                    auto* fed = getFederateCore(command.source_id);
                    if (fed != nullptr) {
                        ActionMessage add(CMD_ADD_INTERDEPENDENCY,
                                          global_broker_id_local,
                                          command.source_id);

                        setActionFlag(add, parent_flag);
                        fed->addAction(add);
                        timeCoord->addDependent(fed->global_id);
                        timeCoord->setAsChild(fed->global_id);
                    }
                }

                if (!hasTimeDependency) {
                    if (timeCoord->addDependency(higher_broker_id)) {
                        hasTimeDependency = true;
                        ActionMessage add(CMD_ADD_INTERDEPENDENCY,
                                          global_broker_id_local,
                                          higher_broker_id);
                        setActionFlag(add, child_flag);

                        transmit(getRoute(higher_broker_id), add);

                        timeCoord->addDependent(higher_broker_id);
                        timeCoord->setAsParent(higher_broker_id);
                    }
                }
                break;
            case CMD_REG_FILTER:

                if (filterFed == nullptr) {
                    generateFilterFederate();
                }
                filterFed->createFilter(filterFedID.load(),
                                        command.source_handle,
                                        command.name(),
                                        command.getString(typeStringLoc),
                                        command.getString(typeOutStringLoc),
                                        checkActionFlag(command, clone_flag));
                connectFilterTiming();
                break;
            case CMD_REG_TRANSLATOR:

                if (translatorFed == nullptr) {
                    generateTranslatorFederate();
                }
                translatorFed->createTranslator(translatorFedID.load(),
                                                command.source_handle,
                                                command.name(),
                                                command.getString(typeStringLoc),
                                                command.getString(unitStringLoc));
                // connectFilterTiming();
                break;
            default:
                return;
        }
        if (!command.payload.empty()) {
            transmit(parent_route_id, std::move(command));
        }
    } else {
        routeMessage(std::move(command));
    }
}